

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall
(anonymous_namespace)::FileSetType::WriteProperties<std::__cxx11::string>
          (FileSetType *this,cmTarget *tgt,cmTargetInternals *impl,string *prop,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,bool clear)

{
  cmMakefile *pcVar1;
  string_view fileSetType;
  string_view sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  string *psVar4;
  cmTargetInternals *pcVar5;
  bool bVar6;
  ulong uVar7;
  cmAlphaNum local_608;
  size_t local_5d8;
  undefined8 uStack_5d0;
  cmAlphaNum local_5c8;
  string local_598;
  size_t local_578;
  undefined8 local_570;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_568;
  cmAlphaNum local_558;
  size_t local_528;
  undefined8 uStack_520;
  cmAlphaNum local_518;
  string local_4e8;
  size_t local_4c8;
  undefined8 local_4c0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_4b8;
  cmAlphaNum local_4a8;
  size_t local_478;
  undefined8 uStack_470;
  cmAlphaNum local_468;
  string local_438;
  string_view local_418;
  size_t local_408;
  char *pcStack_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  cmAlphaNum local_3d8;
  size_t local_3a8;
  undefined8 uStack_3a0;
  cmAlphaNum local_398;
  string local_368;
  undefined1 local_348 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileSetName_1;
  cmAlphaNum local_308;
  size_t local_2d8;
  undefined8 uStack_2d0;
  cmAlphaNum local_2c8;
  string local_298;
  string_view local_278;
  size_t local_268;
  char *pcStack_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  cmAlphaNum local_238;
  size_t local_208;
  undefined8 uStack_200;
  cmAlphaNum local_1f8;
  string local_1c8;
  undefined1 local_1a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileSetName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  allocator<char> local_119;
  string local_118;
  size_t local_f8;
  undefined8 local_f0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_e8;
  size_t local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator<char> local_81;
  string local_80;
  size_t local_60;
  undefined8 local_58;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_50;
  byte local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_38;
  bool clear_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  string *prop_local;
  cmTargetInternals *impl_local;
  cmTarget *tgt_local;
  FileSetType *this_local;
  
  local_39 = clear;
  pbStack_38 = value;
  value_local = prop;
  prop_local = (string *)impl;
  impl_local = (cmTargetInternals *)tgt;
  tgt_local = (cmTarget *)this;
  local_50 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)prop);
  local_60 = ((basic_string_view<char,_std::char_traits<char>_> *)(this + 0x10))->_M_len;
  local_58 = *(undefined8 *)(this + 0x18);
  bVar6 = std::operator==(local_50,*(basic_string_view<char,_std::char_traits<char>_> *)
                                    (this + 0x10));
  pcVar5 = impl_local;
  psVar4 = prop_local;
  if (bVar6) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<cm::static_string_view,void>
              ((string *)&local_80,(static_string_view *)this,&local_81);
    std::__cxx11::string::string((string *)&local_b8,(string *)value);
    local_c8 = *(undefined8 *)this;
    uStack_c0 = *(undefined8 *)(this + 8);
    local_d8 = ((string_view *)(this + 0x60))->_M_len;
    uStack_d0 = *(undefined8 *)(this + 0x68);
    cmTargetInternals::AddDirectoryToFileSet<std::__cxx11::string>
              ((cmTargetInternals *)psVar4,(cmTarget *)pcVar5,&local_80,&local_b8,
               *(string_view *)this,*(string_view *)(this + 0x60),(bool)(local_39 & 1));
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    this_local._7_1_ = 1;
  }
  else {
    local_e8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)value_local);
    local_f8 = ((basic_string_view<char,_std::char_traits<char>_> *)(this + 0x20))->_M_len;
    local_f0 = *(undefined8 *)(this + 0x28);
    bVar6 = std::operator==(local_e8,*(basic_string_view<char,_std::char_traits<char>_> *)
                                      (this + 0x20));
    pcVar5 = impl_local;
    psVar4 = prop_local;
    if (bVar6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<cm::static_string_view,void>
                ((string *)&local_118,(static_string_view *)this,&local_119);
      std::__cxx11::string::string((string *)&local_140,(string *)value);
      cmTargetInternals::AddPathToFileSet<std::__cxx11::string>
                ((cmTargetInternals *)psVar4,(cmTarget *)pcVar5,&local_118,&local_140,
                 *(string_view *)this,*(string_view *)(this + 0x60),(bool)(local_39 & 1));
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
      this_local._7_1_ = 1;
    }
    else {
      sVar2 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)value_local);
      fileSetName.field_2._8_8_ = ((string_view *)(this + 0x30))->_M_len;
      bVar6 = cmHasPrefix(sVar2,*(string_view *)(this + 0x30));
      pbVar3 = value_local;
      if (bVar6) {
        std::basic_string_view<char,_std::char_traits<char>_>::size
                  ((basic_string_view<char,_std::char_traits<char>_> *)(this + 0x30));
        std::__cxx11::string::substr((ulong)local_1a8,(ulong)pbVar3);
        uVar7 = std::__cxx11::string::empty();
        pcVar5 = impl_local;
        psVar4 = prop_local;
        if ((uVar7 & 1) == 0) {
          std::__cxx11::string::string((string *)&local_258,(string *)value);
          local_268 = *(size_t *)this;
          pcStack_260 = *(char **)(this + 8);
          local_2d8 = ((string_view *)(this + 0x70))->_M_len;
          uStack_2d0 = *(undefined8 *)(this + 0x78);
          cmAlphaNum::cmAlphaNum(&local_2c8,*(string_view *)(this + 0x70));
          cmAlphaNum::cmAlphaNum(&local_308," \"");
          cmStrCat<std::__cxx11::string,char[2]>
                    (&local_298,&local_2c8,&local_308,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     (char (*) [2])0xc4a1e0);
          local_278 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_298)
          ;
          sVar2._M_str = pcStack_260;
          sVar2._M_len = local_268;
          cmTargetInternals::AddDirectoryToFileSet<std::__cxx11::string>
                    ((cmTargetInternals *)psVar4,(cmTarget *)pcVar5,(string *)local_1a8,&local_258,
                     sVar2,local_278,(bool)(local_39 & 1));
          std::__cxx11::string::~string((string *)&local_298);
          std::__cxx11::string::~string((string *)&local_258);
        }
        else {
          pcVar1 = (cmMakefile *)prop_local->_M_string_length;
          local_208 = ((string_view *)(this + 0x70))->_M_len;
          uStack_200 = *(undefined8 *)(this + 0x78);
          cmAlphaNum::cmAlphaNum(&local_1f8,*(string_view *)(this + 0x70));
          cmAlphaNum::cmAlphaNum(&local_238," name cannot be empty.");
          cmStrCat<>(&local_1c8,&local_1f8,&local_238);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
        }
        this_local._7_1_ = 1;
        std::__cxx11::string::~string((string *)local_1a8);
      }
      else {
        sVar2 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)value_local);
        fileSetName_1.field_2._8_8_ = ((string_view *)(this + 0x40))->_M_len;
        bVar6 = cmHasPrefix(sVar2,*(string_view *)(this + 0x40));
        pbVar3 = value_local;
        if (bVar6) {
          std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)(this + 0x40));
          std::__cxx11::string::substr((ulong)local_348,(ulong)pbVar3);
          uVar7 = std::__cxx11::string::empty();
          pcVar5 = impl_local;
          psVar4 = prop_local;
          if ((uVar7 & 1) == 0) {
            std::__cxx11::string::string((string *)&local_3f8,(string *)value);
            local_408 = *(size_t *)this;
            pcStack_400 = *(char **)(this + 8);
            local_478 = ((string_view *)(this + 0x70))->_M_len;
            uStack_470 = *(undefined8 *)(this + 0x78);
            cmAlphaNum::cmAlphaNum(&local_468,*(string_view *)(this + 0x70));
            cmAlphaNum::cmAlphaNum(&local_4a8," \"");
            cmStrCat<std::__cxx11::string,char[2]>
                      (&local_438,&local_468,&local_4a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_348,(char (*) [2])0xc4a1e0);
            local_418 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&local_438);
            fileSetType._M_str = pcStack_400;
            fileSetType._M_len = local_408;
            cmTargetInternals::AddPathToFileSet<std::__cxx11::string>
                      ((cmTargetInternals *)psVar4,(cmTarget *)pcVar5,(string *)local_348,&local_3f8
                       ,fileSetType,local_418,(bool)(local_39 & 1));
            std::__cxx11::string::~string((string *)&local_438);
            std::__cxx11::string::~string((string *)&local_3f8);
          }
          else {
            pcVar1 = (cmMakefile *)prop_local->_M_string_length;
            local_3a8 = ((string_view *)(this + 0x70))->_M_len;
            uStack_3a0 = *(undefined8 *)(this + 0x78);
            cmAlphaNum::cmAlphaNum(&local_398,*(string_view *)(this + 0x70));
            cmAlphaNum::cmAlphaNum(&local_3d8," name cannot be empty.");
            cmStrCat<>(&local_368,&local_398,&local_3d8);
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_368);
            std::__cxx11::string::~string((string *)&local_368);
          }
          this_local._7_1_ = 1;
          std::__cxx11::string::~string((string *)local_348);
        }
        else {
          local_4b8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                      std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)value_local);
          local_4c8 = ((basic_string_view<char,_std::char_traits<char>_> *)(this + 0x80))->_M_len;
          local_4c0 = *(undefined8 *)(this + 0x88);
          bVar6 = std::operator==(local_4b8,
                                  *(basic_string_view<char,_std::char_traits<char>_> *)(this + 0x80)
                                 );
          if (bVar6) {
            pcVar1 = (cmMakefile *)prop_local->_M_string_length;
            local_528 = ((string_view *)(this + 0x80))->_M_len;
            uStack_520 = *(undefined8 *)(this + 0x88);
            cmAlphaNum::cmAlphaNum(&local_518,*(string_view *)(this + 0x80));
            cmAlphaNum::cmAlphaNum(&local_558," property is read-only\n");
            cmStrCat<>(&local_4e8,&local_518,&local_558);
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_4e8);
            std::__cxx11::string::~string((string *)&local_4e8);
            this_local._7_1_ = 1;
          }
          else {
            local_568 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)value_local);
            local_578 = ((basic_string_view<char,_std::char_traits<char>_> *)(this + 0xa8))->_M_len;
            local_570 = *(undefined8 *)(this + 0xb0);
            bVar6 = std::operator==(local_568,
                                    *(basic_string_view<char,_std::char_traits<char>_> *)
                                     (this + 0xa8));
            if (bVar6) {
              pcVar1 = (cmMakefile *)prop_local->_M_string_length;
              local_5d8 = ((string_view *)(this + 0xa8))->_M_len;
              uStack_5d0 = *(undefined8 *)(this + 0xb0);
              cmAlphaNum::cmAlphaNum(&local_5c8,*(string_view *)(this + 0xa8));
              cmAlphaNum::cmAlphaNum(&local_608," property is read-only\n");
              cmStrCat<>(&local_598,&local_5c8,&local_608);
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_598);
              std::__cxx11::string::~string((string *)&local_598);
              this_local._7_1_ = 1;
            }
            else {
              this_local._7_1_ = 0;
            }
          }
        }
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool FileSetType::WriteProperties(cmTarget* tgt, cmTargetInternals* impl,
                                  const std::string& prop, ValueType value,
                                  bool clear)
{
  if (prop == this->DefaultDirectoryProperty) {
    impl->AddDirectoryToFileSet(tgt, std::string(this->TypeName), value,
                                this->TypeName, this->DefaultDescription,
                                clear);
    return true;
  }
  if (prop == this->DefaultPathProperty) {
    impl->AddPathToFileSet(tgt, std::string(this->TypeName), value,
                           this->TypeName, this->DefaultDescription, clear);
    return true;
  }
  if (cmHasPrefix(prop, this->DirectoryPrefix)) {
    auto fileSetName = prop.substr(this->DirectoryPrefix.size());
    if (fileSetName.empty()) {
      impl->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(this->ArbitraryDescription, " name cannot be empty."));
    } else {
      impl->AddDirectoryToFileSet(
        tgt, fileSetName, value, this->TypeName,
        cmStrCat(this->ArbitraryDescription, " \"", fileSetName, "\""), clear);
    }
    return true;
  }
  if (cmHasPrefix(prop, this->PathPrefix)) {
    auto fileSetName = prop.substr(this->PathPrefix.size());
    if (fileSetName.empty()) {
      impl->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(this->ArbitraryDescription, " name cannot be empty."));
    } else {
      impl->AddPathToFileSet(
        tgt, fileSetName, value, this->TypeName,
        cmStrCat(this->ArbitraryDescription, " \"", fileSetName, "\""), clear);
    }
    return true;
  }
  if (prop == this->SelfEntries.PropertyName) {
    impl->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(this->SelfEntries.PropertyName, " property is read-only\n"));
    return true;
  }
  if (prop == this->InterfaceEntries.PropertyName) {
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 cmStrCat(this->InterfaceEntries.PropertyName,
                                          " property is read-only\n"));
    return true;
  }
  return false;
}